

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double beta_binomial_pdf(int x,double a,double b,int c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = 0.0;
  if (x <= c && -1 < x) {
    dVar1 = r8_beta((double)x + a,(double)(c - x) + b);
    dVar2 = r8_beta((double)(x + 1),(double)((c - x) + 1));
    dVar3 = r8_beta(a,b);
    dVar1 = dVar1 / (dVar3 * dVar2 * (double)(c + 1));
  }
  return dVar1;
}

Assistant:

double beta_binomial_pdf ( int x, double a, double b, int c )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_BINOMIAL_PDF evaluates the Beta Binomial PDF.
//
//  Discussion:
//
//    PDF(X)(A,B,C) = Beta(A+X,B+C-X)
//      / ( (C+1) * Beta(X+1,C-X+1) * Beta(A,B) )  for 0 <= X <= C.
//
//    This PDF can be reformulated as:
//
//      The beta binomial probability density function for X successes
//      out of N trials is
//
//      PDF2(X)( N, MU, THETA ) =
//        C(N,X) * Product ( 0 <= R <= X - 1 ) ( MU + R * THETA )
//               * Product ( 0 <= R <= N - X - 1 ) ( 1 - MU + R * THETA )
//               / Product ( 0 <= R <= N - 1 )  ( 1 + R * THETA )
//
//      where
//
//        C(N,X) is the combinatorial coefficient;
//        MU is the expectation of the underlying Beta distribution;
//        THETA is a shape parameter.
//
//      A THETA value of 0 ( or A+B --> Infinity ) results in the binomial
//      distribution:
//
//        PDF2(X) ( N, MU, 0 ) = C(N,X) * MU^X * ( 1 - MU )^(N-X)
//
//    Given A, B, C for PDF, then the equivalent PDF2 has:
//
//      N     = C
//      MU    = A / ( A + B )
//      THETA = 1 / ( A + B )
//
//    Given N, MU, THETA for PDF2, the equivalent PDF has:
//
//      A = MU / THETA
//      B = ( 1 - MU ) / THETA
//      C = N
//
//    BETA_BINOMIAL_PDF(X)(1,1,C) = UNIFORM_DISCRETE_PDF(X)(0,C-1)
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    03 September 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int X, the argument of the PDF.
//
//    Input, double A, B, parameters of the PDF.
//    0.0 < A,
//    0.0 < B.
//
//    Input, int C, a parameter of the PDF.
//    0 <= C.
//
//    Output, double BETA_BINOMIAL_PDF, the value of the PDF.
//
{
  double pdf;

  if ( x < 0 )
  {

    pdf = 0.0;
  }
  else if ( x <= c )
  {
    pdf = r8_beta ( a + static_cast<double>(x ), b + static_cast<double>(c - x ) )
      / ( static_cast<double>(c + 1 )
      * r8_beta ( static_cast<double>(x + 1 ),
      static_cast<double>(c - x + 1 ) ) * r8_beta ( a, b ) );
  }
  else if ( c < x )
  {
    pdf = 0.0;
  }

  return pdf;
}